

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O1

void duckdb_je_large_prof_info_get
               (tsd_t *tsd,edata_t *edata,prof_info_t *prof_info,_Bool reset_recent)

{
  prof_tctx_t *ppVar1;
  
  ppVar1 = (prof_tctx_t *)(edata->field_6).e_slab_data.bitmap[2];
  prof_info->alloc_tctx = ppVar1;
  if ((prof_tctx_t *)&DAT_00000001 < ppVar1) {
    duckdb_je_nstime_copy(&prof_info->alloc_time,(nstime_t *)&(edata->field_6).ql_link_inactive);
    prof_info->alloc_size = (size_t)(edata->field_6).ql_link_inactive.qre_prev;
    if (reset_recent) {
      duckdb_je_psset_init((psset_t *)tsd);
      return;
    }
  }
  return;
}

Assistant:

void
large_prof_info_get(tsd_t *tsd, edata_t *edata, prof_info_t *prof_info,
    bool reset_recent) {
	assert(prof_info != NULL);

	prof_tctx_t *alloc_tctx = edata_prof_tctx_get(edata);
	prof_info->alloc_tctx = alloc_tctx;

	if (prof_tctx_is_valid(alloc_tctx)) {
		nstime_copy(&prof_info->alloc_time,
		    edata_prof_alloc_time_get(edata));
		prof_info->alloc_size = edata_prof_alloc_size_get(edata);
		if (reset_recent) {
			/*
			 * Reset the pointer on the recent allocation record,
			 * so that this allocation is recorded as released.
			 */
			prof_recent_alloc_reset(tsd, edata);
		}
	}
}